

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall ON_ClippingPlaneDataList::DeleteEntry(ON_ClippingPlaneDataList *this,uint sn)

{
  uint uVar1;
  ON_ClippingPlaneData *this_00;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->m_list).m_count;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      return;
    }
    this_00 = (this->m_list).m_a[uVar3];
    if ((this_00 != (ON_ClippingPlaneData *)0x0) && (this_00->m_sn == sn)) break;
    uVar3 = uVar3 + 1;
  }
  ON_ClippingPlaneData::~ON_ClippingPlaneData(this_00);
  operator_delete(this_00,0x50);
  ON_SimpleArray<ON_ClippingPlaneData_*>::Remove(&this->m_list,(int)uVar3);
  return;
}

Assistant:

void ON_ClippingPlaneDataList::DeleteEntry(unsigned int sn)
{
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
    {
      delete data;
      m_list.Remove(i);
      return;
    }
  }
}